

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O2

void __thiscall
sing::TimerManager::addTimer
          (TimerManager *this,HttpContext *context,int timeout,function<void_()> *callback)

{
  long lVar1;
  Sha_Timer timer;
  __shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2> local_40;
  undefined8 local_30;
  
  if (context != (HttpContext *)0x0) {
    lVar1 = std::chrono::_V2::system_clock::now();
    local_30 = (long)timeout * 1000000 + lVar1;
    std::
    make_shared<sing::Timer,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::function<void()>const&>
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&timer,(function<void_()> *)&stack0xffffffffffffffd0);
    std::
    priority_queue<std::shared_ptr<sing::Timer>,_std::deque<std::shared_ptr<sing::Timer>,_std::allocator<std::shared_ptr<sing::Timer>_>_>,_sing::cmp>
    ::push(&this->timerQueue,&timer);
    HttpContext::clearTimer(context);
    std::__shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&timer.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>);
    std::__weak_ptr<sing::Timer,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<sing::Timer,(__gnu_cxx::_Lock_policy)2> *)&context->timer,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&timer.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  __assert_fail("context!=nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MisakiOfScut[P]SingHttpServer/src/Timer/TimerManager.cpp"
                ,5,
                "void sing::TimerManager::addTimer(HttpContext *, int, const std::function<void ()> &)"
               );
}

Assistant:

void TimerManager::addTimer(HttpContext* context, int timeout, const std::function<void()>& callback){
    assert(context!=nullptr);
    Sha_Timer timer = std::make_shared<Timer>(Clock::now()+MS(timeout),callback);
    timerQueue.push(timer);
    context->clearTimer();
    context->setTimer(timer);
}